

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5e07f8::AVxEncoderThreadTest::PreEncodeFrameHook
          (AVxEncoderThreadTest *this,VideoSource *param_1,Encoder *encoder)

{
  int arg;
  int ctrl_id;
  
  if ((this->super_EncoderTest).field_0x3dc != '\0') {
    return;
  }
  (*(this->super_CodecTestWith5Params<libaom_test::TestMode,_int,_int,_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
    .super_Test._vptr_Test[8])(this,encoder);
  libaom_test::Encoder::Control(encoder,0xd,this->set_cpu_used_);
  libaom_test::Encoder::Control(encoder,0x20,this->row_mt_);
  if (this->encoding_mode_ - kOnePassGood < 2) {
    libaom_test::Encoder::Control(encoder,0xe,1);
    libaom_test::Encoder::Control(encoder,0x15,5);
    libaom_test::Encoder::Control(encoder,0x16,5);
    libaom_test::Encoder::Control(encoder,0x25,0);
    libaom_test::Encoder::Control(encoder,0x32,4);
    if ((this->set_cpu_used_ < 5) || (this->row_mt_ != 0)) goto LAB_0048dd2b;
    ctrl_id = 0x3b;
    arg = 0;
  }
  else if (this->encoding_mode_ == kRealTime) {
    libaom_test::Encoder::Control(encoder,0xe,0);
    arg = 3;
    libaom_test::Encoder::Control(encoder,0x28,3);
    libaom_test::Encoder::Control(encoder,0x7e,2);
    libaom_test::Encoder::Control(encoder,0x7f,2);
    libaom_test::Encoder::Control(encoder,0x80,3);
    ctrl_id = 0x8e;
  }
  else {
    ctrl_id = 0x19;
    arg = 0x12;
  }
  libaom_test::Encoder::Control(encoder,ctrl_id,arg);
LAB_0048dd2b:
  (this->super_EncoderTest).field_0x3dc = 1;
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource * /*video*/,
                          ::libaom_test::Encoder *encoder) override {
    if (!encoder_initialized_) {
      SetTileSize(encoder);
      encoder->Control(AOME_SET_CPUUSED, set_cpu_used_);
      encoder->Control(AV1E_SET_ROW_MT, row_mt_);
      if (encoding_mode_ == ::libaom_test::kOnePassGood ||
          encoding_mode_ == ::libaom_test::kTwoPassGood) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
        encoder->Control(AOME_SET_ARNR_MAXFRAMES, 5);
        encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
        encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 0);
        encoder->Control(AV1E_SET_MAX_GF_INTERVAL, 4);
        // In row_mt_=0 case, the output of single thread (1 thread) will be
        // compared with multi thread (4 thread) output (as per line no:340).
        // Currently, Loop restoration stage is conditionally disabled for speed
        // 5, 6 when num_workers > 1. Due to this, the match between single
        // thread and multi thread output can not be achieved. Hence, testing
        // this case alone with LR disabled.
        // TODO(aomedia:3446): Remove the constraint on this test case once Loop
        // restoration state is same in both single and multi thread path.
        if (set_cpu_used_ >= 5 && row_mt_ == 0)
          encoder->Control(AV1E_SET_ENABLE_RESTORATION, 0);
      } else if (encoding_mode_ == ::libaom_test::kRealTime) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 0);
        encoder->Control(AV1E_SET_AQ_MODE, 3);
        encoder->Control(AV1E_SET_COEFF_COST_UPD_FREQ, 2);
        encoder->Control(AV1E_SET_MODE_COST_UPD_FREQ, 2);
        encoder->Control(AV1E_SET_MV_COST_UPD_FREQ, 3);
        encoder->Control(AV1E_SET_DV_COST_UPD_FREQ, 3);
      } else {
        encoder->Control(AOME_SET_CQ_LEVEL, kCqLevel);
      }
      encoder_initialized_ = true;
    }
  }